

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators_inl.hpp
# Opt level: O2

void __thiscall CLI::AsSizeValue::AsSizeValue(AsSizeValue *this,bool kb_is_1000)

{
  bool in_DL;
  undefined7 in_register_00000031;
  string *this_00;
  allocator local_a9;
  string local_a8;
  string local_88;
  string local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  local_48;
  
  get_mapping_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              *)&local_48,(AsSizeValue *)CONCAT71(in_register_00000031,kb_is_1000),in_DL);
  ::std::__cxx11::string::string((string *)&local_a8,"UNIT",&local_a9);
  AsNumberWithUnit::AsNumberWithUnit<unsigned_long>
            (&this->super_AsNumberWithUnit,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              *)&local_48,CASE_INSENSITIVE,&local_a8);
  ::std::__cxx11::string::~string((string *)&local_a8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&local_48);
  if (kb_is_1000) {
    ::std::__cxx11::string::string
              ((string *)&local_68,"SIZE [b, kb(=1000b), kib(=1024b), ...]",(allocator *)&local_a8);
    Validator::description((Validator *)this,&local_68);
    this_00 = &local_68;
  }
  else {
    ::std::__cxx11::string::string
              ((string *)&local_88,"SIZE [b, kb(=1024b), ...]",(allocator *)&local_a8);
    Validator::description((Validator *)this,&local_88);
    this_00 = &local_88;
  }
  ::std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

CLI11_INLINE AsSizeValue::AsSizeValue(bool kb_is_1000) : AsNumberWithUnit(get_mapping(kb_is_1000)) {
    if(kb_is_1000) {
        description("SIZE [b, kb(=1000b), kib(=1024b), ...]");
    } else {
        description("SIZE [b, kb(=1024b), ...]");
    }
}